

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_features.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_Feature_Vector_Data::Make_Unique(Am_Feature_Vector_Data *this)

{
  bool bVar1;
  Am_Feature_Vector_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_Feature_Vector_Data *)operator_new(0xc0);
    Am_Feature_Vector_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

Am_Feature_Vector_Data::Am_Feature_Vector_Data()
{
  int i;

  y = NewVector(NFEATURES);

  npoints = 0;
  initial_sin = initial_cos = 0.0;
  path_r = 0;
  path_th = 0;
  abs_th = 0;
  sharpness = 0;
  for (i = 0; i < NFEATURES; i++)
    y[i] = 0.0;
  calculated = false;
}